

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTableModel.cpp
# Opt level: O0

void __thiscall BaseTableModel::reload(BaseTableModel *this)

{
  QString local_38;
  string *local_20;
  string *str;
  BaseTableModel *pBStack_10;
  int id;
  BaseTableModel *this_local;
  
  pBStack_10 = this;
  QAbstractItemModel::beginResetModel();
  std::vector<std::pair<int,_QString>,_std::allocator<std::pair<int,_QString>_>_>::clear
            (&this->mItems);
  for (str._4_4_ = 0; str._4_4_ < 0x40; str._4_4_ = str._4_4_ + 1) {
    local_20 = (string *)(**(code **)(*(long *)this + 0x198))(this,str._4_4_);
    if (local_20 != (string *)0x0) {
      QString::fromStdString(&local_38,local_20);
      std::vector<std::pair<int,QString>,std::allocator<std::pair<int,QString>>>::
      emplace_back<int&,QString>
                ((vector<std::pair<int,QString>,std::allocator<std::pair<int,QString>>> *)
                 &this->mItems,(int *)((long)&str + 4),&local_38);
      QString::~QString(&local_38);
    }
  }
  QAbstractItemModel::endResetModel();
  return;
}

Assistant:

void BaseTableModel::reload() {
    beginResetModel();

    mItems.clear();
    for (int id = 0; id < (int)trackerboy::InstrumentTable::MAX_SIZE; ++id) {
        auto str = sourceName(id);
        if (str) {
            mItems.emplace_back(id, QString::fromStdString(*str));
        }
    }

    endResetModel();
}